

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t * archive_acl_to_text_w(archive_acl *acl,ssize_t *text_len,wchar_t flags,archive *a)

{
  wchar_t wVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t sVar4;
  uint uVar5;
  wchar_t *pwVar6;
  char *msg;
  int iVar7;
  archive_acl_entry *paVar8;
  wchar_t want_type;
  wchar_t *wp;
  wchar_t local_5c;
  wchar_t *local_58;
  archive *local_50;
  size_t *local_48;
  ssize_t local_40;
  wchar_t *wname;
  
  if ((acl->acl_types & 0x3c00U) == 0) {
    want_type = flags & 0x300;
    if (want_type == L'\0') {
      want_type = L'̀';
    }
  }
  else {
    want_type = L'㰀';
    if ((acl->acl_types & 0x300U) != 0) {
      want_type = L'\0';
    }
  }
  if (want_type != L'\0') {
    if (want_type == L'̀') {
      flags = flags | 2;
    }
    local_50 = a;
    sVar2 = archive_acl_text_len(acl,want_type,flags,L'\x01',a,(archive_string_conv *)0x0);
    if (sVar2 != 0) {
      local_5c = L',';
      if ((flags & 8U) == 0) {
        local_5c = L'\n';
      }
      wp = (wchar_t *)malloc(sVar2 * 4);
      if (wp == (wchar_t *)0x0) {
        piVar3 = __errno_location();
        if (*piVar3 != 0xc) {
          return (wchar_t *)0x0;
        }
        msg = "No memory";
      }
      else {
        iVar7 = 0;
        local_58 = wp;
        local_48 = (size_t *)text_len;
        local_40 = sVar2;
        if (((uint)want_type >> 8 & 1) != 0) {
          append_entry_w(&wp,(wchar_t *)0x0,L'Ā',L'✒',flags,(wchar_t *)0x0,acl->mode & 0x1c0,
                         L'\xffffffff');
          wVar1 = local_5c;
          *wp = local_5c;
          wp = wp + 1;
          append_entry_w(&wp,(wchar_t *)0x0,L'Ā',L'✔',flags,(wchar_t *)0x0,acl->mode & 0x38,
                         L'\xffffffff');
          *wp = wVar1;
          wp = wp + 1;
          append_entry_w(&wp,(wchar_t *)0x0,L'Ā',L'✖',flags,(wchar_t *)0x0,acl->mode & 7,
                         L'\xffffffff');
          iVar7 = 3;
        }
        paVar8 = acl->acl_head;
        if (paVar8 != (archive_acl_entry *)0x0) {
          do {
            wVar1 = paVar8->type;
            if (((wVar1 & want_type) != 0) &&
               (((wVar1 != L'Ā' || (uVar5 = paVar8->tag + L'\xffffd8ee', 4 < uVar5)) ||
                ((0x15U >> (uVar5 & 0x1f) & 1) == 0)))) {
              pwVar6 = anon_var_dwarf_17e7a4;
              if (wVar1 != L'Ȁ') {
                pwVar6 = (wchar_t *)0x0;
              }
              if ((flags & 2U) == 0) {
                pwVar6 = (wchar_t *)0x0;
              }
              wVar1 = archive_mstring_get_wcs(local_50,&paVar8->name,&wname);
              if (wVar1 == L'\0') {
                if (0 < iVar7) {
                  *wp = local_5c;
                  wp = wp + 1;
                }
                wVar1 = L'\xffffffff';
                if ((flags & 1U) != 0) {
                  wVar1 = paVar8->id;
                }
                append_entry_w(&wp,pwVar6,paVar8->type,paVar8->tag,flags,wname,paVar8->permset,wVar1
                              );
                iVar7 = iVar7 + 1;
              }
              else if ((wVar1 < L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
                free(local_58);
                return (wchar_t *)0x0;
              }
            }
            paVar8 = paVar8->next;
          } while (paVar8 != (archive_acl_entry *)0x0);
        }
        pwVar6 = local_58;
        *wp = L'\0';
        wp = wp + 1;
        sVar4 = wcslen(local_58);
        if ((long)sVar4 < local_40) {
          if (local_48 != (size_t *)0x0) {
            *local_48 = sVar4;
            return pwVar6;
          }
          return pwVar6;
        }
        msg = "Buffer overrun";
      }
      __archive_errx(1,msg);
    }
    return (wchar_t *)0x0;
  }
  return (wchar_t *)0x0;
}

Assistant:

wchar_t *
archive_acl_to_text_w(struct archive_acl *acl, ssize_t *text_len, int flags,
    struct archive *a)
{
	int count;
	ssize_t length;
	size_t len;
	const wchar_t *wname;
	const wchar_t *prefix;
	wchar_t separator;
	struct archive_acl_entry *ap;
	int id, r, want_type;
	wchar_t *wp, *ws;

	want_type = archive_acl_text_want_type(acl, flags);

	/* Both NFSv4 and POSIX.1 types found */
	if (want_type == 0)
		return (NULL);

	if (want_type == ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)
		flags |= ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT;

	length = archive_acl_text_len(acl, want_type, flags, 1, a, NULL);

	if (length == 0)
		return (NULL);

	if (flags & ARCHIVE_ENTRY_ACL_STYLE_SEPARATOR_COMMA)
		separator = L',';
	else
		separator = L'\n';

	/* Now, allocate the string and actually populate it. */
	wp = ws = (wchar_t *)malloc(length * sizeof(wchar_t));
	if (wp == NULL) {
		if (errno == ENOMEM)
			__archive_errx(1, "No memory");
		return (NULL);
	}
	count = 0;

	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_USER_OBJ, flags, NULL,
		    acl->mode & 0700, -1);
		*wp++ = separator;
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_GROUP_OBJ, flags, NULL,
		    acl->mode & 0070, -1);
		*wp++ = separator;
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		    ARCHIVE_ENTRY_ACL_OTHER, flags, NULL,
		    acl->mode & 0007, -1);
		count += 3;
	}

	for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
		if ((ap->type & want_type) == 0)
			continue;
		/*
		 * Filemode-mapping ACL entries are stored exclusively in
		 * ap->mode so they should not be in the list
		 */
		if ((ap->type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS)
		    && (ap->tag == ARCHIVE_ENTRY_ACL_USER_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ
		    || ap->tag == ARCHIVE_ENTRY_ACL_OTHER))
			continue;
		if (ap->type == ARCHIVE_ENTRY_ACL_TYPE_DEFAULT &&
		    (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) != 0)
			prefix = L"default:";
		else
			prefix = NULL;
		r = archive_mstring_get_wcs(a, &ap->name, &wname);
		if (r == 0) {
			if (count > 0)
				*wp++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry_w(&wp, prefix, ap->type, ap->tag, flags,
			    wname, ap->permset, id);
			count++;
		} else if (r < 0 && errno == ENOMEM) {
			free(ws);
			return (NULL);
		}
	}

	/* Add terminating character */
	*wp++ = L'\0';

	len = wcslen(ws);

	if ((ssize_t)len > (length - 1))
		__archive_errx(1, "Buffer overrun");

	if (text_len != NULL)
		*text_len = len;

	return (ws);
}